

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O1

DataFlowState * __thiscall
slang::analysis::DataFlowAnalysis::copyState
          (DataFlowState *__return_storage_ptr__,DataFlowAnalysis *this,DataFlowState *source)

{
  int in_ECX;
  long lVar1;
  void *in_R8;
  undefined8 in_R9;
  ulong uVar2;
  char *pcVar3;
  IntervalMap<unsigned_long,_std::monostate,_3U> local_70;
  
  pcVar3 = (__return_storage_ptr__->assigned).
           super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
           firstElement;
  (__return_storage_ptr__->assigned).
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ =
       (pointer)pcVar3;
  (__return_storage_ptr__->assigned).
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len = 0;
  (__return_storage_ptr__->assigned).
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.cap = 2;
  __return_storage_ptr__->reachable = true;
  __return_storage_ptr__->reachable = source->reachable;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::reserve
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
             __return_storage_ptr__,
             (source->assigned).
             super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len);
  if ((source->assigned).
      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      IntervalMap<unsigned_long,_std::monostate,_3U>::clone
                (&local_70,
                 (__fn *)((long)&((source->assigned).
                                  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                                 .data_)->field_0 + lVar1),&this->bitMapAllocator,in_ECX,in_R8,in_R9
                 ,pcVar3);
      SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
      emplace_back<slang::IntervalMap<unsigned_long,std::monostate,3u>>
                ((SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> *)
                 __return_storage_ptr__,&local_70);
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x40;
    } while (uVar2 < (source->assigned).
                     super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                     len);
  }
  return __return_storage_ptr__;
}

Assistant:

DataFlowState DataFlowAnalysis::copyState(const DataFlowState& source) {
    DataFlowState result;
    result.reachable = source.reachable;
    result.assigned.reserve(source.assigned.size());
    for (size_t i = 0; i < source.assigned.size(); i++)
        result.assigned.emplace_back(source.assigned[i].clone(bitMapAllocator));
    return result;
}